

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O3

int XMLSearch_init(XMLSearch *search)

{
  if (search != (XMLSearch *)0x0) {
    search->tag = (SXML_CHAR *)0x0;
    search->attributes = (XMLAttribute *)0x0;
    search->n_attributes = 0;
    search->text = (SXML_CHAR *)0x0;
    search->next = (_XMLSearch *)0x0;
    search->prev = (_XMLSearch *)0x0;
    search->stop_at = (XMLNode *)0xffffffffffffffff;
    search->init_value = 0x19770522;
    return 1;
  }
  return 0;
}

Assistant:

int XMLSearch_init(XMLSearch* search)
{
	if (search == NULL)
		return FALSE;

	search->tag = NULL;
	search->text = NULL;
	search->attributes = NULL;
	search->n_attributes = 0;
	search->next = NULL;
	search->prev = NULL;
	search->stop_at = INVALID_XMLNODE_POINTER; /* Because 'NULL' can be a valid value */
	search->init_value = XML_INIT_DONE;
	
	return TRUE;
}